

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_addis(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  int32_t iVar1;
  uint32_t uVar2;
  target_long simm;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  iVar1 = SIMM(ctx->opcode);
  uVar2 = rA(ctx->opcode);
  if (uVar2 == 0) {
    uVar2 = rD(ctx->opcode);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar2],(long)iVar1 << 0x10);
  }
  else {
    uVar2 = rD(ctx->opcode);
    ret = cpu_gpr[uVar2];
    uVar2 = rA(ctx->opcode);
    tcg_gen_addi_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar2],(long)iVar1 << 0x10);
  }
  return;
}

Assistant:

static void gen_addis(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_long simm = SIMM(ctx->opcode);

    if (rA(ctx->opcode) == 0) {
        /* lis case */
        tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], simm << 16);
    } else {
        tcg_gen_addi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)],
                        cpu_gpr[rA(ctx->opcode)], simm << 16);
    }
}